

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

void replace_in_place(QString *str,QSpan<unsigned_long,_18446744073709551615UL> indices,
                     qsizetype blen,QStringView after)

{
  char16_t *pcVar1;
  unsigned_long uVar2;
  long lVar3;
  size_t sVar4;
  long lVar5;
  char16_t *pcVar6;
  char16_t *pcVar7;
  unsigned_long *puVar8;
  char16_t *__src;
  long lVar9;
  storage_type_conflict *__src_00;
  longlong __n2;
  long lVar10;
  reverse_iterator end;
  
  __src_00 = after.m_data;
  lVar9 = after.m_size;
  lVar10 = indices.super_QSpanBase<unsigned_long,_18446744073709551615UL>.m_size;
  puVar8 = indices.super_QSpanBase<unsigned_long,_18446744073709551615UL>.m_data;
  if (lVar9 - blen == 0) {
    if (lVar10 != 0) {
      lVar3 = 0;
      do {
        if (0 < lVar9) {
          memmove((str->d).ptr + *(long *)((long)puVar8 + lVar3),__src_00,lVar9 * 2);
        }
        lVar3 = lVar3 + 8;
      } while (lVar10 << 3 != lVar3);
    }
  }
  else {
    if (lVar9 < blen) {
      pcVar1 = (str->d).ptr;
      uVar2 = *puVar8;
      pcVar6 = pcVar1 + uVar2;
      if (0 < lVar9) {
        memmove(pcVar6,__src_00,lVar9 * 2);
        pcVar6 = pcVar6 + lVar9;
      }
      pcVar7 = pcVar1 + blen + uVar2;
      if (lVar10 << 3 != 8) {
        lVar3 = 8;
        do {
          lVar5 = *(long *)((long)puVar8 + lVar3);
          sVar4 = (long)pcVar1 + (lVar5 * 2 - (long)pcVar7);
          if (sVar4 != 0) {
            memmove(pcVar6,pcVar7,sVar4);
          }
          pcVar6 = (char16_t *)((long)pcVar6 + sVar4);
          if (0 < lVar9) {
            memmove(pcVar6,__src_00,lVar9 * 2);
            pcVar6 = pcVar6 + lVar9;
          }
          pcVar7 = pcVar1 + blen + lVar5;
          lVar3 = lVar3 + 8;
        } while (lVar10 << 3 != lVar3);
      }
      sVar4 = (long)(str->d).ptr + ((str->d).size * 2 - (long)pcVar7);
      if (sVar4 != 0) {
        memmove(pcVar6,pcVar7,sVar4);
      }
      QString::resize(str,(long)((long)pcVar6 + (sVar4 - (long)pcVar1)) >> 1);
      return;
    }
    lVar3 = (str->d).size;
    QString::resize(str,(lVar9 - blen) * lVar10 + lVar3);
    if (lVar10 != 0) {
      pcVar1 = (str->d).ptr;
      pcVar6 = pcVar1 + (str->d).size;
      lVar10 = lVar10 << 3;
      pcVar7 = pcVar1 + lVar3;
      do {
        lVar3 = *(long *)((long)puVar8 + lVar10 + -8);
        __src = pcVar1 + lVar3 + blen;
        lVar5 = (long)pcVar7 - (long)__src >> 1;
        if ((long)pcVar7 - (long)__src != 0) {
          memmove(pcVar6 + -lVar5,__src,(long)pcVar7 - (long)__src);
        }
        if (lVar9 != 0) {
          memmove(pcVar6 + (-lVar5 - lVar9),__src_00,lVar9 * 2);
        }
        pcVar6 = pcVar6 + (-lVar5 - lVar9);
        lVar10 = lVar10 + -8;
        pcVar7 = pcVar1 + lVar3;
      } while (lVar10 != 0);
    }
  }
  return;
}

Assistant:

static void replace_in_place(QString &str, QSpan<size_t> indices,
                             qsizetype blen, QStringView after)
{
    const qsizetype alen = after.size();
    const char16_t *after_b = after.utf16();
    const char16_t *after_e = after.utf16() + after.size();

    if (blen == alen) { // Replace in place
        for (size_t index : indices)
            std::copy_n(after_b, alen, str.data_ptr().begin() + index);
    } else if (blen > alen) { // Replace from front
        char16_t *begin = str.data_ptr().begin();
        char16_t *hit = begin + indices.front();
        char16_t *to = hit;
        to = std::copy_n(after_b, alen, to);
        char16_t *movestart = hit + blen;
        for (size_t index : indices.sliced(1)) {
            hit = begin + index;
            to = std::move(movestart, hit, to);
            to = std::copy_n(after_b, alen, to);
            movestart = hit + blen;
        }
        to = std::move(movestart, str.data_ptr().end(), to);
        str.resize(std::distance(begin, to));
    } else { // blen < alen, Replace from back
        const qsizetype oldSize = str.data_ptr().size;
        const qsizetype adjust = indices.size() * (alen - blen);
        const qsizetype newSize = oldSize + adjust;

        str.resize(newSize);
        char16_t *begin = str.data_ptr().begin();
        char16_t *moveend = begin + oldSize;
        char16_t *to = str.data_ptr().end();

        for (auto it = indices.rbegin(), end = indices.rend(); it != end; ++it) {
            char16_t *hit = begin + *it;
            char16_t *movestart = hit + blen;
            to = std::move_backward(movestart, moveend, to);
            to = std::copy_backward(after_b, after_e, to);
            moveend = hit;
        }
    }
}